

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O0

void __thiscall Rml::DataModel::OnElementRemove(DataModel *this,Element *element)

{
  pointer this_00;
  pointer this_01;
  Element *local_18;
  Element *element_local;
  DataModel *this_local;
  
  local_18 = element;
  element_local = (Element *)this;
  EraseAliases(this,element);
  this_00 = ::std::unique_ptr<Rml::DataViews,_std::default_delete<Rml::DataViews>_>::operator->
                      (&this->views);
  DataViews::OnElementRemove(this_00,local_18);
  this_01 = ::std::unique_ptr<Rml::DataControllers,_std::default_delete<Rml::DataControllers>_>::
            operator->(&this->controllers);
  DataControllers::OnElementRemove(this_01,local_18);
  itlib::
  flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
  ::erase<Rml::Element*>
            ((flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
              *)&this->attached_elements,&local_18);
  return;
}

Assistant:

void DataModel::OnElementRemove(Element* element)
{
	EraseAliases(element);
	views->OnElementRemove(element);
	controllers->OnElementRemove(element);
	attached_elements.erase(element);
}